

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall Assimp::IFC::Schema_2x3::IfcSpaceType::~IfcSpaceType(IfcSpaceType *this)

{
  undefined1 *puVar1;
  
  *(undefined8 *)&this[-1].field_0x48 = 0x89e488;
  *(undefined8 *)&this->field_0x30 = 0x89e5a0;
  *(undefined8 *)&this[-1].field_0xd0 = 0x89e4b0;
  *(undefined8 *)&this[-1].field_0xe0 = 0x89e4d8;
  *(undefined8 *)&this[-1].field_0x138 = 0x89e500;
  this[-1].super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcSpaceType,_1UL>._vptr_ObjectHelper =
       (_func_int **)0x89e528;
  *(undefined8 *)&this[-1].field_0x1c8 = 0x89e550;
  *(undefined8 *)this = 0x89e578;
  if (*(undefined1 **)&this->field_0x10 != &this->field_0x20) {
    operator_delete(*(undefined1 **)&this->field_0x10);
  }
  *(undefined8 *)&this[-1].field_0x48 = 0x89e868;
  *(undefined8 *)&this->field_0x30 = 0x89e930;
  *(undefined8 *)&this[-1].field_0xd0 = 0x89e890;
  *(undefined8 *)&this[-1].field_0xe0 = 0x89e8b8;
  *(undefined8 *)&this[-1].field_0x138 = 0x89e8e0;
  this[-1].super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcSpaceType,_1UL>._vptr_ObjectHelper =
       (_func_int **)0x89e908;
  puVar1 = *(undefined1 **)
            &this[-1].super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcSpaceType,_1UL>.field_0x10;
  if (puVar1 != &this[-1].super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcSpaceType,_1UL>.field_0x20)
  {
    operator_delete(puVar1);
  }
  IfcTypeProduct::~IfcTypeProduct
            ((IfcTypeProduct *)&this[-1].field_0x48,&PTR_construction_vtable_24__0089e5c8);
  return;
}

Assistant:

IfcSpaceType() : Object("IfcSpaceType") {}